

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_ClassifySupport
              (DdManager *dd,DdNode *f,DdNode *g,DdNode **common,DdNode **onlyF,DdNode **onlyG)

{
  uint uVar1;
  int *piVar2;
  uint index;
  int *piVar3;
  int *support;
  ulong uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar8 = dd->sizeZ;
  }
  piVar3 = (int *)malloc((long)(int)uVar8 << 2);
  if (piVar3 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    support = (int *)malloc((long)(int)uVar8 << 2);
    if (support != (int *)0x0) {
      uVar4 = 0;
      uVar7 = 0;
      if (0 < (int)uVar8) {
        uVar7 = (ulong)uVar8;
      }
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        piVar3[uVar4] = 0;
        support[uVar4] = 0;
      }
      ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),piVar3);
      ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
      ddSupportStep((DdNode *)((ulong)g & 0xfffffffffffffffe),support);
      ddClearFlag((DdNode *)((ulong)g & 0xfffffffffffffffe));
      pDVar5 = dd->one;
      *onlyG = pDVar5;
      *onlyF = pDVar5;
      *common = pDVar5;
      piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      do {
        do {
          if ((int)uVar8 < 1) {
            free(piVar3);
            free(support);
            piVar3 = (int *)(((ulong)*common & 0xfffffffffffffffe) + 4);
            *piVar3 = *piVar3 + -1;
            piVar3 = (int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4);
            *piVar3 = *piVar3 + -1;
            piVar3 = (int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4);
            *piVar3 = *piVar3 + -1;
            return 1;
          }
          uVar1 = uVar8 - 1;
          index = uVar1;
          if ((int)uVar8 <= dd->size) {
            index = dd->invperm[uVar1];
          }
          uVar8 = uVar1;
        } while ((piVar3[(int)index] == 0) && (support[(int)index] == 0));
        pDVar5 = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
        piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        if (support[(int)index] == 0) {
          pDVar6 = Cudd_bddAnd(dd,*onlyF,pDVar5);
          if (pDVar6 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,*common);
            Cudd_RecursiveDeref(dd,*onlyF);
            Cudd_RecursiveDeref(dd,*onlyG);
            Cudd_RecursiveDeref(dd,pDVar5);
LAB_006716d8:
            free(piVar3);
            piVar3 = support;
            goto LAB_006716e2;
          }
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          Cudd_RecursiveDeref(dd,*onlyF);
          *onlyF = pDVar6;
        }
        else if (piVar3[(int)index] == 0) {
          pDVar6 = Cudd_bddAnd(dd,*onlyG,pDVar5);
          if (pDVar6 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,*common);
            Cudd_RecursiveDeref(dd,*onlyF);
            Cudd_RecursiveDeref(dd,*onlyG);
            Cudd_RecursiveDeref(dd,pDVar5);
            goto LAB_006716d8;
          }
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          Cudd_RecursiveDeref(dd,*onlyG);
          *onlyG = pDVar6;
        }
        else {
          pDVar6 = Cudd_bddAnd(dd,*common,pDVar5);
          if (pDVar6 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,*common);
            Cudd_RecursiveDeref(dd,*onlyF);
            Cudd_RecursiveDeref(dd,*onlyG);
            Cudd_RecursiveDeref(dd,pDVar5);
            free(piVar3);
            piVar3 = support;
            goto LAB_006716e2;
          }
          piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          Cudd_RecursiveDeref(dd,*common);
          *common = pDVar6;
        }
        Cudd_RecursiveDeref(dd,pDVar5);
      } while( true );
    }
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_006716e2:
    free(piVar3);
  }
  return 0;
}

Assistant:

int
Cudd_ClassifySupport(
  DdManager * dd /* manager */,
  DdNode * f /* first DD */,
  DdNode * g /* second DD */,
  DdNode ** common /* cube of shared variables */,
  DdNode ** onlyF /* cube of variables only in f */,
  DdNode ** onlyG /* cube of variables only in g */)
{
    int *supportF, *supportG;
    DdNode *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support arrays for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    supportF = ABC_ALLOC(int,size);
    if (supportF == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    supportG = ABC_ALLOC(int,size);
    if (supportG == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(supportF);
        return(0);
    }
    for (i = 0; i < size; i++) {
        supportF[i] = 0;
        supportG[i] = 0;
    }

    /* Compute supports and clean up markers. */
    ddSupportStep(Cudd_Regular(f),supportF);
    ddClearFlag(Cudd_Regular(f));
    ddSupportStep(Cudd_Regular(g),supportG);
    ddClearFlag(Cudd_Regular(g));

    /* Classify variables and create cubes. */
    *common = *onlyF = *onlyG = DD_ONE(dd);
    cuddRef(*common); cuddRef(*onlyF); cuddRef(*onlyG);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (supportF[i] == 0 && supportG[i] == 0) continue;
        var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
        cuddRef(var);
        if (supportG[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyF,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyF);
            *onlyF = tmp;
        } else if (supportF[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyG,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyG);
            *onlyG = tmp;
        } else {
            tmp = Cudd_bddAnd(dd,*common,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*common);
            *common = tmp;
        }
        Cudd_RecursiveDeref(dd,var);
    }

    ABC_FREE(supportF); ABC_FREE(supportG);
    cuddDeref(*common); cuddDeref(*onlyF); cuddDeref(*onlyG);
    return(1);

}